

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::initCorge
          (Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  PointerBuilder local_40;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = ::capnp::bounded<15u>();
  ::capnp::_::StructBuilder::
  setDataField<capnproto_test::capnp::test::TestInterleavedGroups::Group2::Which>
            (&this->_builder,uVar1,CORGE);
  uVar1 = ::capnp::bounded<13u>();
  ::capnp::_::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = ::capnp::bounded<5u>();
  ::capnp::_::StructBuilder::setDataField<unsigned_long>(&this->_builder,uVar1,0);
  uVar1 = ::capnp::bounded<3u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  ::capnp::_::PointerBuilder::clear(&local_28);
  uVar1 = ::capnp::bounded<5u>();
  ::capnp::_::StructBuilder::getPointerField(&local_40,&this->_builder,uVar1);
  ::capnp::_::PointerBuilder::clear(&local_40);
  memcpy(&local_68,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_60;
  base.segment = (SegmentBuilder *)local_68;
  base.data = (void *)local_58;
  base.pointers = (WirePointer *)uStack_50;
  base.dataSize = (undefined4)local_48;
  base.pointerCount = local_48._4_2_;
  base._38_2_ = local_48._6_2_;
  Corge::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename TestInterleavedGroups::Group2::Corge::Builder TestInterleavedGroups::Group2::Builder::initCorge() {
  _builder.setDataField<TestInterleavedGroups::Group2::Which>(
      ::capnp::bounded<15>() * ::capnp::ELEMENTS, TestInterleavedGroups::Group2::CORGE);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<13>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint64_t>(::capnp::bounded<5>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<5>() * ::capnp::POINTERS).clear();
  return typename TestInterleavedGroups::Group2::Corge::Builder(_builder);
}